

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::DrawGridYAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  uint uVar1;
  undefined4 extraout_XMM0_Da;
  float theScreenY;
  undefined1 local_70 [8];
  PRect theTickRect;
  string theFormatString;
  bool theIsMajorTick;
  float theY;
  Painter *inPainter_local;
  PRect *inRect_local;
  PPlot *this_local;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mStyle);
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mTickInfo.mStyle);
  uVar1 = (*this->mYTickIterator->_vptr_TickIterator[2])();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)&theTickRect.mH);
    PRect::PRect((PRect *)local_70);
    (*inPainter->_vptr_Painter[7])(inPainter,200,200);
    (*inPainter->_vptr_Painter[6])(inPainter,200,200);
    if (((this->mYAxisSetup).mTickInfo.mTicksOn & 1U) != 0) {
      while (uVar1 = (*this->mYTickIterator->_vptr_TickIterator[3])
                               (this->mYTickIterator,
                                (undefined1 *)((long)&theFormatString.field_2 + 0xc),
                                (undefined1 *)((long)&theFormatString.field_2 + 0xb),&theTickRect.mH
                               ), (uVar1 & 1) != 0) {
        if (((theFormatString.field_2._M_local_buf[0xb] & 1U) != 0) &&
           (((this->mGridInfo).mYGridOn & 1U) != 0)) {
          (*this->mYTrafo->_vptr_Trafo[2])(theFormatString.field_2._12_4_);
          (**inPainter->_vptr_Painter)
                    ((float)inRect->mX,extraout_XMM0_Da,(float)(inRect->mX + inRect->mW));
        }
      }
    }
    (*inPainter->_vptr_Painter[7])(inPainter,0,0);
    (*inPainter->_vptr_Painter[6])(inPainter,0,0);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&theTickRect.mH);
  }
  return this_local._7_1_;
}

Assistant:

bool PPlot::DrawGridYAxis (const PRect &inRect, Painter &inPainter) const {
        inPainter.SetStyle (mYAxisSetup.mStyle);
        
        // ticks
        inPainter.SetStyle (mYAxisSetup.mTickInfo.mStyle);
        if (!mYTickIterator->Init ()) {
            return false;
        }
        
        float theY;
        bool theIsMajorTick;
        string theFormatString;
        PRect theTickRect;

        inPainter.SetFillColor (200,200,200);
        inPainter.SetLineColor (200,200,200);
        
        // draw gridlines
        if (mYAxisSetup.mTickInfo.mTicksOn) {
            while (mYTickIterator->GetNextTick (theY, theIsMajorTick, theFormatString)) {

                if (theIsMajorTick && mGridInfo.mYGridOn) {
                    float theScreenY = mYTrafo->Transform(theY);
                    inPainter.DrawLine (inRect.mX, theScreenY, inRect.mX + inRect.mW, theScreenY);
                }
            }
        }

        inPainter.SetFillColor (0,0,0);
        inPainter.SetLineColor (0,0,0);
        return true;
    }